

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O2

bool ON_OrderEdgesAroundVertex(ON_Brep *B,int vid,ON_2dex *trim_ends,bool *bClosed)

{
  long lVar1;
  int iVar2;
  int iVar3;
  ON_BrepVertex *pOVar4;
  uint *puVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ON_BrepEdge *pOVar10;
  byte bVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ON_BrepTrim *this;
  
  *bClosed = false;
  if (-1 < vid) {
    pOVar4 = (B->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.m_a;
    uVar9 = 0;
    if (pOVar4[(uint)vid].m_vertex_index < 0) goto LAB_0043f6a0;
    *bClosed = true;
    uVar8 = pOVar4[(uint)vid].m_ei.m_count;
    pOVar10 = (B->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a;
    uVar13 = 0;
    if (0 < (int)uVar8) {
      uVar13 = (ulong)uVar8;
    }
    for (; uVar13 != uVar9; uVar9 = uVar9 + 1) {
      iVar2 = pOVar10[pOVar4[(uint)vid].m_ei.m_a[uVar9]].m_ti.m_count;
      if (iVar2 != 2) {
        if (iVar2 == 1) {
          *bClosed = false;
          bVar6 = OrderEdgesAroundOpenVertex(B,vid,trim_ends);
          return bVar6;
        }
        goto LAB_0043f69e;
      }
    }
    if ((0 < (int)uVar8) && (iVar2 = *pOVar4[(uint)vid].m_ei.m_a, pOVar10[iVar2].m_ti.m_count == 2))
    {
      iVar3 = *pOVar10[iVar2].m_ti.m_a;
      lVar14 = (long)iVar3;
      trim_ends->i = iVar3;
      bVar11 = pOVar10[iVar2].m_vi[0] != vid ^
               (B->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a
               [lVar14].m_bRev3d;
      uVar7 = (uint)bVar11;
      trim_ends->j = (uint)bVar11;
      lVar15 = 0;
      while (lVar15 < (int)uVar8) {
        if (uVar7 == 0) {
          uVar8 = ON_Brep::PrevNonsingularTrim(B,(int)lVar14);
        }
        else {
          uVar8 = ON_Brep::NextNonsingularTrim(B,(int)lVar14);
        }
        if ((int)uVar8 < 0) break;
        this = (B->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a +
               uVar8;
        pOVar10 = ON_BrepTrim::Edge(this);
        if ((pOVar10 == (ON_BrepEdge *)0x0) || ((pOVar10->m_ti).m_count != 2)) break;
        lVar1 = lVar15 + 1;
        puVar5 = (uint *)(pOVar10->m_ti).m_a;
        uVar8 = puVar5[*puVar5 == uVar8];
        lVar14 = (long)(int)uVar8;
        uVar7 = 1 - trim_ends[lVar15].j;
        if ((B->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a[lVar14].
            m_bRev3d != this->m_bRev3d) {
          uVar7 = trim_ends[lVar15].j;
        }
        if ((uVar8 == trim_ends->i) && (uVar7 == trim_ends->j)) {
          uVar9 = (ulong)(pOVar4[(uint)vid].m_ei.m_count == (int)lVar1);
          goto LAB_0043f6a0;
        }
        for (lVar12 = 0; lVar15 != lVar12; lVar12 = lVar12 + 1) {
          if ((uVar8 == trim_ends[lVar12 + 1].i) && (uVar7 == trim_ends[lVar12 + 1].j))
          goto LAB_0043f69e;
        }
        trim_ends[lVar1].i = uVar8;
        trim_ends[lVar1].j = uVar7;
        lVar15 = lVar1;
        uVar8 = pOVar4[(uint)vid].m_ei.m_count;
      }
    }
  }
LAB_0043f69e:
  uVar9 = 0;
LAB_0043f6a0:
  return SUB81(uVar9,0);
}

Assistant:

bool ON_OrderEdgesAroundVertex(const ON_Brep& B, int vid,
                               ON_2dex* trim_ends,//Must be at as big as the edge count at the vertex
                               bool& bClosed)

{
  bClosed = false;
  if (vid<0)
    return false;
  const ON_BrepVertex& V = B.m_V[vid];
  if (V.m_vertex_index < 0)
    return false;
  int i;
  bClosed = true;
  for (i=0; i<V.m_ei.Count(); i++){
    const ON_BrepEdge& E = B.m_E[V.m_ei[i]];
    if (E.m_ti.Count() == 2)
      continue;
    if (E.m_ti.Count() == 1){
      bClosed = false;
      break;
    }
    return false;
  }
  return (bClosed) ? 
    OrderEdgesAroundClosedVertex(B, vid, trim_ends) : OrderEdgesAroundOpenVertex(B, vid, trim_ends);
}